

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabin_karp.cpp
# Opt level: O1

int strStr(string *haystack,string *needle)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  long local_70;
  long local_68;
  ulong local_60;
  string *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  string *local_38;
  
  local_60 = needle->_M_string_length;
  uVar10 = (uint)haystack->_M_string_length;
  uVar9 = (uint)local_60;
  if (uVar10 == 0) {
    iVar12 = -(uint)(uVar9 != 0);
  }
  else {
    iVar12 = -1;
    if ((int)uVar9 <= (int)uVar10) {
      iVar13 = 1;
      if (0 < (int)uVar9) {
        uVar5 = local_60 & 0xffffffff;
        do {
          iVar13 = (iVar13 * 0x1f) % 1000000;
          uVar7 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      if ((int)uVar9 < 1) {
        iVar11 = 0;
      }
      else {
        uVar5 = 0;
        iVar11 = 0;
        do {
          iVar11 = ((int)(needle->_M_dataplus)._M_p[uVar5] + iVar11 * 0x1f) % 1000000;
          uVar5 = uVar5 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar5);
      }
      if (0 < (int)uVar10) {
        local_50 = (long)(int)uVar9;
        lVar8 = (long)(int)(uVar9 - 1);
        uVar5 = (ulong)(uVar10 & 0x7fffffff);
        local_70 = 1 - local_50;
        local_68 = -local_50;
        uVar6 = 0;
        iVar12 = 0;
        local_58 = haystack;
        local_48 = uVar5;
        local_40 = lVar8;
        local_38 = needle;
        do {
          pcVar1 = (local_58->_M_dataplus)._M_p;
          iVar12 = ((int)pcVar1[uVar6] + iVar12 * 0x1f) % 1000000;
          if (lVar8 <= (long)uVar6) {
            if (local_50 <= (long)uVar6) {
              iVar2 = pcVar1[uVar6 + local_68] * iVar13;
              iVar2 = iVar12 + ((iVar2 / 1000000) * 1000000 - iVar2);
              iVar12 = iVar2 + 1000000;
              if (-1 < iVar2) {
                iVar12 = iVar2;
              }
            }
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," hash_code: ",0xc);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," target_code: ",0xe);
            plVar4 = (long *)std::ostream::operator<<(poVar3,iVar11);
            std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
            std::ostream::put((char)plVar4);
            std::ostream::flush();
            lVar8 = local_40;
            uVar5 = local_48;
            if (iVar12 == iVar11) {
              std::__cxx11::string::substr((ulong)&local_90,(ulong)local_58);
              if (local_88 == local_38->_M_string_length) {
                if (local_88 == 0) {
                  bVar14 = true;
                }
                else {
                  iVar2 = bcmp(local_90,(local_38->_M_dataplus)._M_p,local_88);
                  bVar14 = iVar2 == 0;
                }
              }
              else {
                bVar14 = false;
              }
              if (local_90 != local_80) {
                operator_delete(local_90);
              }
              lVar8 = local_40;
              uVar5 = local_48;
              if (bVar14) {
                return ((int)uVar6 - (int)local_60) + 1;
              }
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        iVar12 = -1;
      }
    }
  }
  return iVar12;
}

Assistant:

int strStr(std::string haystack, std::string needle) 
{
    int needle_size = needle.length();
    int haystack_size = haystack.length();
    if(haystack_size == 0 )
    {
        if (needle_size ==0)
        {
            return 0;
        }
        else 
        {
            return -1;
        }
    }
    else if(haystack_size<needle_size)
    {
        return -1;
    }
    // using Rabin-Karp algorithm
    static const int kBase = 1000000;
    static const int kHashNum = 31;
    int power = 1.0;
    for(int i = 0; i < needle_size;++i)
    {
        power = (power*kHashNum)%kBase;
    }

    int target_code = 0;
    for(int i = 0; i<needle_size;++i)
    {
        target_code = (target_code*kHashNum+needle[i])%kBase;
    }

    int hash_code = 0;
    for(int i = 0; i<haystack_size;++i)
    {
        // abc+d
        hash_code = (hash_code*kHashNum+haystack[i])%kBase;
        if(i<needle_size-1)
        {
            continue;
        }
        // abcd-a
        if(i>=needle_size)
        {
            hash_code = hash_code -(haystack[i-needle_size]*power)%kBase;
            if(hash_code<0)
            {
                hash_code+=kBase;
            }
        }
        std::cout<<i<<" hash_code: "<< hash_code
                 <<" target_code: "<< target_code <<std::endl;
        // double check the std::string
        if(hash_code==target_code)
        {
            if(haystack.substr(i-needle_size+1,needle_size)==needle)
            {
                return i-needle_size+1;
            }
        }
    }
    return -1;
}